

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Input::preflightKey
          (Input *this,char *Key,bool Required,bool param_3,bool *UseDefault,void **SaveInfo)

{
  bool bVar1;
  ret_type pMVar2;
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> *puVar3;
  error_category *peVar4;
  HNode *pHVar5;
  Twine local_d0;
  Twine local_b8;
  Twine local_a0;
  Twine local_88;
  StringRef local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  void **local_40;
  HNode **local_38;
  
  *UseDefault = false;
  if ((this->EC)._M_value == 0) {
    if (this->CurrentNode == (HNode *)0x0) {
      if (Required) {
        peVar4 = (error_category *)std::_V2::generic_category();
        (this->EC)._M_value = 0x16;
        (this->EC)._M_cat = peVar4;
      }
    }
    else {
      local_38 = &this->CurrentNode;
      local_40 = SaveInfo;
      pMVar2 = dyn_cast<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
      if (pMVar2 == (ret_type)0x0) {
        if ((!Required) &&
           (bVar1 = isa_impl_wrap<llvm::yaml::Input::EmptyHNode,_llvm::yaml::Input::HNode_*const,_const_llvm::yaml::Input::HNode_*>
                    ::doit(local_38), bVar1)) {
          return false;
        }
        pHVar5 = this->CurrentNode;
        Twine::Twine((Twine *)&local_60,"not a mapping");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,Key,(allocator<char> *)&local_88);
        SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ::push_back((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     *)&pMVar2->ValidKeys,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        StringRef::StringRef(&local_70,Key);
        puVar3 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                 ::operator[](&pMVar2->Mapping,local_70);
        pHVar5 = (puVar3->_M_t).
                 super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
                 .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl;
        if (pHVar5 != (HNode *)0x0) {
          *local_40 = *local_38;
          *local_38 = pHVar5;
          return true;
        }
        if (!Required) {
          *UseDefault = true;
          return false;
        }
        pHVar5 = this->CurrentNode;
        Twine::Twine(&local_d0,"missing required key \'");
        Twine::Twine(&local_b8,Key);
        Twine::concat(&local_88,&local_d0,&local_b8);
        Twine::Twine(&local_a0,"\'");
        Twine::concat((Twine *)&local_60,&local_88,&local_a0);
      }
      setError(this,pHVar5,(Twine *)&local_60);
    }
  }
  return false;
}

Assistant:

bool Input::preflightKey(const char *Key, bool Required, bool, bool &UseDefault,
                         void *&SaveInfo) {
  UseDefault = false;
  if (EC)
    return false;

  // CurrentNode is null for empty documents, which is an error in case required
  // nodes are present.
  if (!CurrentNode) {
    if (Required)
      EC = make_error_code(errc::invalid_argument);
    return false;
  }

  MapHNode *MN = dyn_cast<MapHNode>(CurrentNode);
  if (!MN) {
    if (Required || !isa<EmptyHNode>(CurrentNode))
      setError(CurrentNode, "not a mapping");
    return false;
  }
  MN->ValidKeys.push_back(Key);
  HNode *Value = MN->Mapping[Key].get();
  if (!Value) {
    if (Required)
      setError(CurrentNode, Twine("missing required key '") + Key + "'");
    else
      UseDefault = true;
    return false;
  }
  SaveInfo = CurrentNode;
  CurrentNode = Value;
  return true;
}